

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_2(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  QPDFObjectHandle pages;
  shared_ptr<Pl_StdioFile> out;
  allocator<char> local_89;
  QPDFObjectHandle kids;
  QPDFObjectHandle root;
  QPDFObjectHandle page;
  QPDFObjectHandle encrypt;
  QPDFObjectHandle contents;
  QPDFObjectHandle trailer;
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&root,"/Info",(allocator<char> *)&page);
  QPDFObjectHandle::getKey((string *)&kids);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&encrypt,"/CreationDate",(allocator<char> *)&contents);
  QPDFObjectHandle::getKey((string *)&pages);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&out);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&out);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pages.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&encrypt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&root);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&root,"/Info",(allocator<char> *)&page);
  QPDFObjectHandle::getKey((string *)&kids);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&encrypt,"/Producer",(allocator<char> *)&contents);
  QPDFObjectHandle::getKey((string *)&pages);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&out);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&out);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pages.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&encrypt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&root);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"/Encrypt",(allocator<char> *)&root);
  QPDFObjectHandle::getKey((string *)&encrypt);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string<std::allocator<char>>((string *)&root,"/O",(allocator<char> *)&kids);
  QPDFObjectHandle::getKey((string *)&pages);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&out);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&out);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pages.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&root);
  std::__cxx11::string::string<std::allocator<char>>((string *)&root,"/U",(allocator<char> *)&kids);
  QPDFObjectHandle::getKey((string *)&pages);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&out);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&out);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pages.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&root);
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"/Pages",(allocator<char> *)&kids);
  QPDFObjectHandle::getKey((string *)&pages);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"/Kids",(allocator<char> *)&page);
  QPDFObjectHandle::getKey((string *)&kids);
  std::__cxx11::string::~string((string *)&out);
  QPDFObjectHandle::getArrayItem((int)&page);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out,"/Contents",&local_89);
  QPDFObjectHandle::getKey((string *)&contents);
  std::__cxx11::string::~string((string *)&out);
  QUtil::binary_stdout();
  std::make_shared<Pl_StdioFile,char_const(&)[9],_IO_FILE*&>
            ((char (*) [9])&out,(_IO_FILE **)"filtered");
  QPDFObjectHandle::pipeStreamData
            ((Pipeline *)&contents,
             (int)out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             qpdf_dl_none,true,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&contents.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pages.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&encrypt.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_2(QPDF& pdf, char const* arg2)
{
    // Encrypted file.  This test case is designed for a specific
    // PDF file.

    QPDFObjectHandle trailer = pdf.getTrailer();
    std::cout << trailer.getKey("/Info").getKey("/CreationDate").getStringValue() << std::endl;
    std::cout << trailer.getKey("/Info").getKey("/Producer").getStringValue() << std::endl;

    QPDFObjectHandle encrypt = trailer.getKey("/Encrypt");
    std::cout << encrypt.getKey("/O").unparse() << std::endl;
    std::cout << encrypt.getKey("/U").unparse() << std::endl;

    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle pages = root.getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");
    QPDFObjectHandle page = kids.getArrayItem(1); // second page
    QPDFObjectHandle contents = page.getKey("/Contents");
    QUtil::binary_stdout();
    auto out = std::make_shared<Pl_StdioFile>("filtered", stdout);
    contents.pipeStreamData(out.get(), 0, qpdf_dl_generalized);
}